

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

QBrush * __thiscall QPainter::background(QPainter *this)

{
  bool bVar1;
  QPainterPrivate *this_00;
  QPainterDummyState *pQVar2;
  pointer pQVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  char *in_stack_ffffffffffffffb8;
  QMessageLogger *in_stack_ffffffffffffffd0;
  QBrush *pQVar4;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPainter *)0x594c75);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x594c8b);
  if (bVar1) {
    pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x594cd8);
    pQVar4 = &pQVar3->bgBrush;
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffd0,in_RDI,(int)((ulong)this_00 >> 0x20),
               in_stack_ffffffffffffffb8);
    QMessageLogger::warning(local_28,"QPainter::background: Painter not active");
    pQVar2 = QPainterPrivate::fakeState(this_00);
    pQVar4 = &pQVar2->brush;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

const QBrush &QPainter::background() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::background: Painter not active");
        return d->fakeState()->brush;
    }
    return d->state->bgBrush;
}